

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetScrollHereY(float center_y_ratio)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *window;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = center_y_ratio;
  window = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).ItemSpacing.y;
  fVar6 = (window->WindowPadding).y;
  fVar2 = (window->DC).CursorPosPrevLine.y;
  uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar6),2);
  bVar4 = (bool)((byte)uVar3 & 1);
  fVar6 = (float)((uint)bVar4 * (int)fVar6 + (uint)!bVar4 * (int)fVar1);
  fVar1 = fVar2 - fVar6;
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)((fVar6 + fVar2 + (window->DC).PrevLineSize.y) - fVar1)),
                           auVar7._0_16_,ZEXT416((uint)fVar1));
  SetScrollFromPosY(window,auVar5._0_4_ - (window->Pos).y,center_y_ratio);
  fVar6 = (window->WindowPadding).y - fVar6;
  uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar6),ZEXT816(0) << 0x40,2);
  (window->ScrollTargetEdgeSnapDist).y = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar6);
  return;
}

Assistant:

void ImGui::SetScrollHereY(float center_y_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_y = ImMax(window->WindowPadding.y, g.Style.ItemSpacing.y);
    float target_pos_y = ImLerp(window->DC.CursorPosPrevLine.y - spacing_y, window->DC.CursorPosPrevLine.y + window->DC.PrevLineSize.y + spacing_y, center_y_ratio);
    SetScrollFromPosY(window, target_pos_y - window->Pos.y, center_y_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.y = ImMax(0.0f, window->WindowPadding.y - spacing_y);
}